

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void * ImFileLoadToMemory(char *filename,char *mode,size_t *out_file_size,int padding_bytes)

{
  FILE *__stream;
  ImU64 __n;
  void *__ptr;
  size_t sVar1;
  
  if (out_file_size != (size_t *)0x0) {
    *out_file_size = 0;
  }
  __stream = fopen(filename,mode);
  if (__stream != (FILE *)0x0) {
    __n = ImFileGetSize((ImFileHandle)__stream);
    if (__n != 0xffffffffffffffff) {
      __ptr = ImGui::MemAlloc(__n + (long)padding_bytes);
      if (__ptr != (void *)0x0) {
        sVar1 = fread(__ptr,1,__n,__stream);
        if (sVar1 != __n) {
          ImFileClose((ImFileHandle)__stream);
          ImGui::MemFree(__ptr);
          return (void *)0x0;
        }
        if (0 < padding_bytes) {
          memset((void *)((long)__ptr + __n),0,(long)padding_bytes);
        }
        ImFileClose((ImFileHandle)__stream);
        if (out_file_size != (size_t *)0x0) {
          *out_file_size = __n;
          return __ptr;
        }
        return __ptr;
      }
    }
    ImFileClose((ImFileHandle)__stream);
  }
  return (void *)0x0;
}

Assistant:

void*   ImFileLoadToMemory(const char* filename, const char* mode, size_t* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && mode);
    if (out_file_size)
        *out_file_size = 0;

    ImFileHandle f;
    if ((f = ImFileOpen(filename, mode)) == NULL)
        return NULL;

    size_t file_size = (size_t)ImFileGetSize(f);
    if (file_size == (size_t)-1)
    {
        ImFileClose(f);
        return NULL;
    }

    void* file_data = IM_ALLOC(file_size + padding_bytes);
    if (file_data == NULL)
    {
        ImFileClose(f);
        return NULL;
    }
    if (ImFileRead(file_data, 1, file_size, f) != file_size)
    {
        ImFileClose(f);
        IM_FREE(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void*)(((char*)file_data) + file_size), 0, (size_t)padding_bytes);

    ImFileClose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}